

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O3

Tick __thiscall MetaSim::Simulation::run_to(Simulation *this,Tick *stop)

{
  Tick *pTVar1;
  long lVar2;
  Tick TVar3;
  Simulation *this_00;
  
  pTVar1 = &this->globTime;
  this_00 = this;
  while( true ) {
    TVar3 = getNextEventTime(this_00);
    lVar2 = stop->v;
    if (lVar2 < TVar3.v) break;
    this_00 = this;
    TVar3 = sim_step(this);
    pTVar1->v = TVar3.v;
  }
  TVar3.v = pTVar1->v;
  if (pTVar1->v < lVar2) {
    pTVar1->v = lVar2;
    TVar3.v = lVar2;
  }
  return (Tick)TVar3.v;
}

Assistant:

const Tick Simulation::run_to(const Tick &stop)
    {
        try {
            while (getNextEventTime() <= stop) {
                globTime = sim_step();
            }
        } catch (NoMoreEventsInQueue &e) {
            cerr << "No more events in queue: simulation time = " 
                 << globTime << endl;
        }

        if (globTime < stop) globTime = stop; 

        return globTime;
    }